

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O0

bool __thiscall QFileInfo::makeAbsolute(QFileInfo *this)

{
  bool bVar1;
  QFileInfoPrivate *pQVar2;
  QFileInfo *in_RDI;
  long in_FS_OFFSET;
  undefined7 in_stack_ffffffffffffffa8;
  undefined1 in_stack_ffffffffffffffaf;
  QFileInfo *this_00;
  bool local_21;
  QFileInfo local_20 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = QSharedDataPointer<QFileInfoPrivate>::constData
                     ((QSharedDataPointer<QFileInfoPrivate> *)0x2ab81a);
  if ((*(uint *)&pQVar2->field_0x1d8 >> 0x1e & 1) == 0) {
    QSharedDataPointer<QFileInfoPrivate>::constData
              ((QSharedDataPointer<QFileInfoPrivate> *)0x2ab837);
    bVar1 = QFileSystemEntry::isRelative((QFileSystemEntry *)0x2ab843);
    if (bVar1) {
      this_00 = local_20;
      absoluteFilePath(in_RDI);
      setFile(this_00,(QString *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      QString::~QString((QString *)0x2ab87d);
      local_21 = true;
      goto LAB_002ab8a2;
    }
  }
  local_21 = false;
LAB_002ab8a2:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_21;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileInfo::makeAbsolute()
{
    if (d_ptr.constData()->isDefaultConstructed
            || !d_ptr.constData()->fileEntry.isRelative())
        return false;

    setFile(absoluteFilePath());
    return true;
}